

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O3

void __thiscall
ot::commissioner::CommissionerImpl::CommandDomainReset
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr)

{
  char cVar1;
  undefined8 *puVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  Error error;
  writer write;
  string local_120;
  ErrorCode local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  writer local_d8;
  ErrorCode local_d0;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  format_string_checker<char> local_a8;
  _Any_data local_78;
  code *local_68;
  undefined1 local_58 [8];
  _Alloc_hider local_50;
  char local_40 [16];
  
  local_100 = kNone;
  local_f0 = 0;
  local_e8[0] = 0;
  local_f8 = local_e8;
  iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((char)iVar3 == '\0') {
    local_a8._0_8_ = local_a8._0_8_ & 0xffffffff00000000;
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "the commissioner is not active";
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1e;
    local_a8.context_.super_basic_format_parse_context<char>._16_8_ = 0;
    local_a8.parse_funcs_[0] = (parse_func)0x0;
    pcVar4 = "the commissioner is not active";
    local_a8.context_.types_ = local_a8.types_;
    do {
      pcVar5 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",&local_a8);
      }
      pcVar4 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_a8;
    fmt::v10::vformat_abi_cxx11_(&local_120,(v10 *)0x22bb54,(string_view)ZEXT816(0x1e),args);
    local_d0 = kInvalidState;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
  }
  else {
    iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[10])(this);
    if ((char)iVar3 != '\0') {
      std::function<void_(ot::commissioner::Error)>::function
                ((function<void_(ot::commissioner::Error)> *)&local_78,aHandler);
      puVar2 = &local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_;
      local_a8._0_8_ = puVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"/c/rt","");
      SendProxyMessage(this,(ErrorHandler *)&local_78,aDstAddr,(string *)&local_a8);
      if ((undefined8 *)local_a8._0_8_ != puVar2) {
        operator_delete((void *)local_a8._0_8_);
      }
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      goto LAB_0019af12;
    }
    local_a8._0_8_ = (ulong)(uint)local_a8._4_4_ << 0x20;
    pcVar4 = "resetting a device is not in CCM Mode";
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "resetting a device is not in CCM Mode";
    local_a8.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
    local_a8.context_.super_basic_format_parse_context<char>._16_8_ = 0;
    local_a8.parse_funcs_[0] = (parse_func)0x0;
    local_d8.handler_ = &local_a8;
    local_a8.context_.types_ = local_a8.types_;
    do {
      cVar1 = *pcVar4;
      pcVar5 = pcVar4;
      while (cVar1 != '{') {
        pcVar5 = pcVar5 + 1;
        if (pcVar5 == "") {
          fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&local_d8,pcVar4,"");
          goto LAB_0019ae8f;
        }
        cVar1 = *pcVar5;
      }
      fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&local_d8,pcVar4,pcVar5);
      pcVar4 = fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar5,"",&local_a8);
    } while (pcVar4 != "");
LAB_0019ae8f:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)&local_a8;
    fmt::v10::vformat_abi_cxx11_
              (&local_120,(v10 *)"resetting a device is not in CCM Mode",(string_view)ZEXT816(0x25),
               args_00);
    local_d0 = kInvalidState;
    local_c8[0] = local_b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_c8,local_120._M_dataplus._M_p,
               local_120._M_dataplus._M_p + local_120._M_string_length);
  }
  local_100 = local_d0;
  std::__cxx11::string::operator=((string *)&local_f8,(string *)local_c8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p);
  }
LAB_0019af12:
  if (local_100 != kNone) {
    local_58._0_4_ = local_100;
    local_50._M_p = local_40;
    std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_f8,local_f8 + local_f0);
    if ((aHandler->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*aHandler->_M_invoker)((_Any_data *)aHandler,(Error *)local_58);
    if (local_50._M_p != local_40) {
      operator_delete(local_50._M_p);
    }
  }
  if (local_f8 != local_e8) {
    operator_delete(local_f8);
  }
  return;
}

Assistant:

void CommissionerImpl::CommandDomainReset(ErrorHandler aHandler, const std::string &aDstAddr)
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("resetting a device is not in CCM Mode"));
    SendProxyMessage(aHandler, aDstAddr, uri::kMgmtDomainReset);

exit:
    if (error != ERROR_NONE)
    {
        aHandler(error);
    }
}